

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

SubControl __thiscall QToolButtonPrivate::newHoverControl(QToolButtonPrivate *this,QPoint *pos)

{
  long lVar1;
  QWidget *this_00;
  int iVar2;
  QStyle *pQVar3;
  SubControl SVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QStyleOptionToolButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  memset(&opt,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&opt);
  (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&opt);
  opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar3 = QWidget::style(this_00);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xd0))(pQVar3,4,&opt,pos,this_00);
  *(int *)&(this->super_QAbstractButtonPrivate).field_0x2b4 = iVar2;
  if (iVar2 == 0) {
    (this->hoverRect).x1 = 0;
    (this->hoverRect).y1 = 0;
    (this->hoverRect).x2 = -1;
    (this->hoverRect).y2 = -1;
    SVar4 = SC_None;
  }
  else {
    pQVar3 = QWidget::style(this_00);
    QVar5 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))
                             (pQVar3,4,&opt,
                              *(undefined4 *)&(this->super_QAbstractButtonPrivate).field_0x2b4,
                              this_00);
    this->hoverRect = QVar5;
    SVar4 = *(SubControl *)&(this->super_QAbstractButtonPrivate).field_0x2b4;
  }
  QStyleOptionToolButton::~QStyleOptionToolButton(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar4;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QToolButtonPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QToolButton);
    QStyleOptionToolButton opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ToolButton, &opt, pos, q);
    if (hoverControl == QStyle::SC_None)
        hoverRect = QRect();
    else
        hoverRect = q->style()->subControlRect(QStyle::CC_ToolButton, &opt, hoverControl, q);
    return hoverControl;
}